

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::CondVar::Wakeup(CondVar *this,PerThreadSynch *w)

{
  ulong mu;
  long lVar1;
  Mutex *pMVar2;
  uint uVar3;
  ulong mu_00;
  PerThreadSynch *pPVar4;
  int mode;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 in_RDX;
  synchronization_internal *this_00;
  bool bVar5;
  
  if (((w->waitp->timeout).ns_ != 0) || (pMVar2 = w->waitp->cvmu, pMVar2 == (Mutex *)0x0)) {
    w->next = (PerThreadSynch *)0x0;
    (w->state)._M_i = kAvailable;
    AbslInternalPerThreadSemPost((ThreadIdentity *)w);
    return;
  }
  if (w->waitp->cond != (Condition *)0x0) {
    Mutex::Fer();
    in_RDX = extraout_RDX_05;
  }
  if ((w->waitp->timeout).ns_ != 0) {
    Mutex::Fer();
    in_RDX = extraout_RDX_06;
  }
  if (w->waitp->cv_word != (atomic<long> *)0x0) {
    Mutex::Fer();
    in_RDX = extraout_RDX_07;
  }
  this_00 = (synchronization_internal *)0x0;
  do {
    mode = (int)in_RDX;
    mu = (pMVar2->mu_).super___atomic_base<long>._M_i;
    if (((w->waitp->how != (MuHow)kSharedS | 8) & (uint)mu) == 0) {
      w->next = (PerThreadSynch *)0x0;
      (w->state)._M_i = kAvailable;
      AbslInternalPerThreadSemPost((ThreadIdentity *)w);
      in_RDX = extraout_RDX_00;
LAB_0014b14f:
      bVar5 = false;
    }
    else {
      if ((mu & 0x44) == 0) {
        pPVar4 = Enqueue((PerThreadSynch *)0x0,w->waitp,mu,2);
        in_RDX = extraout_RDX_01;
        if (pPVar4 == (PerThreadSynch *)0x0) {
          Mutex::Fer();
          in_RDX = extraout_RDX_03;
        }
        mode = (int)in_RDX;
        LOCK();
        bVar5 = mu == (pMVar2->mu_).super___atomic_base<long>._M_i;
        if (bVar5) {
          (pMVar2->mu_).super___atomic_base<long>._M_i =
               (ulong)((uint)mu & 0xbb) | (ulong)pPVar4 | 4;
        }
        UNLOCK();
        if (bVar5) goto LAB_0014b14f;
      }
      else if ((mu & 0x40) == 0) {
        LOCK();
        mu_00 = (pMVar2->mu_).super___atomic_base<long>._M_i;
        bVar5 = mu == mu_00;
        if (bVar5) {
          (pMVar2->mu_).super___atomic_base<long>._M_i = mu | 0x44;
          mu_00 = mu;
        }
        UNLOCK();
        if (bVar5) {
          pPVar4 = Enqueue((PerThreadSynch *)(mu_00 & 0xffffffffffffff00),w->waitp,mu_00,2);
          in_RDX = extraout_RDX;
          if (pPVar4 == (PerThreadSynch *)0x0) {
            Mutex::Fer();
            in_RDX = extraout_RDX_04;
          }
          do {
            lVar1 = (pMVar2->mu_).super___atomic_base<long>._M_i;
            LOCK();
            bVar5 = lVar1 == (pMVar2->mu_).super___atomic_base<long>._M_i;
            if (bVar5) {
              (pMVar2->mu_).super___atomic_base<long>._M_i =
                   (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar4 | 4;
            }
            UNLOCK();
          } while (!bVar5);
          goto LAB_0014b14f;
        }
      }
      uVar3 = synchronization_internal::MutexDelay(this_00,1,mode);
      this_00 = (synchronization_internal *)(ulong)uVar3;
      bVar5 = true;
      in_RDX = extraout_RDX_02;
    }
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void CondVar::Wakeup(PerThreadSynch *w) {
  if (w->waitp->timeout.has_timeout() || w->waitp->cvmu == nullptr) {
    // The waiting thread only needs to observe "w->state == kAvailable" to be
    // released, we must cache "cvmu" before clearing "next".
    Mutex *mu = w->waitp->cvmu;
    w->next = nullptr;
    w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
    Mutex::IncrementSynchSem(mu, w);
  } else {
    w->waitp->cvmu->Fer(w);
  }
}